

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

FlatFilePos __thiscall
node::BlockManager::FindNextBlockPos(BlockManager *this,uint nAddSize,uint nHeight,uint64_t nTime)

{
  vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *this_00;
  uint *puVar1;
  Notifications *pNVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Logger *pLVar7;
  pointer pCVar8;
  optional<node::BlockfileCursor> *poVar9;
  size_t sVar10;
  long lVar11;
  _Storage<node::BlockfileCursor,_true> _Var12;
  _Storage<node::BlockfileCursor,_true> _Var13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  bool out_of_space;
  FlatFilePos pos;
  bool finalize_undo;
  int nFile;
  int last_blockfile;
  BlockfileType chain_type;
  uint nHeight_local;
  char *local_90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  BlockfileCursor new_cursor;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock16.super_unique_lock._M_owns = false;
  nHeight_local = nHeight;
  criticalblock16.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock16.super_unique_lock);
  bVar3 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value <= (int)nHeight_local &
          (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  chain_type = (BlockfileType)bVar3;
  if ((this->m_blockfile_cursors)._M_elems[bVar3].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
    if (bVar3 == 0) {
      __assert_fail("chain_type == BlockfileType::ASSUMED",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                    ,0x348,
                    "FlatFilePos node::BlockManager::FindNextBlockPos(unsigned int, unsigned int, uint64_t)"
                   );
    }
    iVar5 = 0;
    iVar6 = 0;
    if ((this->m_blockfile_cursors)._M_elems[0].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
      iVar6 = (this->m_blockfile_cursors)._M_elems[0].
              super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
              super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
    }
    if ((this->m_blockfile_cursors)._M_elems[1].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
      iVar5 = (this->m_blockfile_cursors)._M_elems[1].
              super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
              super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    new_cursor.undo_height = 0;
    new_cursor.file_num = iVar5 + 1;
    (this->m_blockfile_cursors)._M_elems[bVar3].
    super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
    super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value = new_cursor;
    (this->m_blockfile_cursors)._M_elems[bVar3].
    super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
    super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
    pLVar7 = LogInstance();
    bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar7,BLOCKSTORAGE,Debug);
    if (bVar4) {
      logging_function._M_str = "FindNextBlockPos";
      logging_function._M_len = 0x10;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x65;
      LogPrintFormatInternal<node::BlockfileType,node::BlockfileCursor>
                (logging_function,source_file,0x34b,BLOCKSTORAGE,Debug,
                 (ConstevalFormatString<2U>)0x7eba57,&chain_type,&new_cursor);
    }
  }
  nFile = (this->m_blockfile_cursors)._M_elems[chain_type].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
  this_00 = &this->m_blockfile_info;
  iVar6 = (int)((ulong)((long)(this->m_blockfile_info).
                              super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_blockfile_info).
                             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  last_blockfile = nFile;
  if (SBORROW4(nFile,iVar6 * -0x33333333) == nFile + iVar6 * 0x33333333 < 0) {
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize(this_00,(long)nFile + 1);
  }
  finalize_undo = false;
  uVar14 = nAddSize + 1;
  if (nAddSize < 0x10000) {
    uVar14 = 0x10000;
  }
  uVar16 = 0x8000000;
  if ((this->m_opts).fast_prune != false) {
    uVar16 = uVar14;
  }
  if (nAddSize < uVar16) {
    lVar11 = (long)nFile;
    pCVar8 = (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>)._M_impl.
             super__Vector_impl_data._M_start + lVar11;
    uVar14 = pCVar8->nSize;
    while (uVar16 <= uVar14 + nAddSize) {
      uVar14 = pCVar8->nHeightLast;
      poVar9 = inline_assertion_check<true,std::optional<node::BlockfileCursor>&>
                         ((optional<node::BlockfileCursor> *)
                          &(this->m_blockfile_cursors)._M_elems[chain_type].
                           super__Optional_base<node::BlockfileCursor,_true,_true>,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                          ,0x366,"FindNextBlockPos","m_blockfile_cursors[chain_type]");
      finalize_undo =
           uVar14 == (poVar9->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
                     super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.
                     undo_height;
      iVar5 = 0;
      iVar6 = 0;
      if ((this->m_blockfile_cursors)._M_elems[0].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
        iVar6 = (this->m_blockfile_cursors)._M_elems[0].
                super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
      }
      if ((this->m_blockfile_cursors)._M_elems[1].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
        iVar5 = (this->m_blockfile_cursors)._M_elems[1].
                super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
      }
      if (iVar5 < iVar6) {
        iVar5 = iVar6;
      }
      _Var12._0_4_ = iVar5 + 1;
      _Var12._M_value.undo_height = 0;
      uVar17 = (ulong)chain_type;
      (this->m_blockfile_cursors)._M_elems[uVar17].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_payload = _Var12;
      if ((this->m_blockfile_cursors)._M_elems[uVar17].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
        (this->m_blockfile_cursors)._M_elems[uVar17].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
      }
      nFile = _Var12._0_4_;
      if ((int)((ulong)((long)(this->m_blockfile_info).
                              super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_blockfile_info).
                             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333 <=
          (int)_Var12._0_4_) {
        std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
                  (this_00,(long)(iVar5 + 2));
      }
      lVar11 = (long)nFile;
      pCVar8 = (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>).
               _M_impl.super__Vector_impl_data._M_start + lVar11;
      uVar14 = pCVar8->nSize;
    }
    pos.nFile = (int)lVar11;
    pos.nPos = pCVar8->nSize;
    if (pos.nFile != last_blockfile) {
      pLVar7 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar7,BLOCKSTORAGE,Debug);
      if (bVar4) {
        CBlockFileInfo::ToString_abi_cxx11_
                  ((string *)&new_cursor,
                   (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>).
                   _M_impl.super__Vector_impl_data._M_start + last_blockfile);
        logging_function_00._M_str = "FindNextBlockPos";
        logging_function_00._M_len = 0x10;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_00._M_len = 0x65;
        LogPrintFormatInternal<int,std::__cxx11::string,int,unsigned_int>
                  (logging_function_00,source_file_00,0x377,BLOCKSTORAGE,Debug,
                   (ConstevalFormatString<4U>)0x7ebabf,&last_blockfile,(string *)&new_cursor,&nFile,
                   &nHeight_local);
        if (new_cursor != (BlockfileCursor)&local_68) {
          operator_delete((void *)new_cursor,local_68._M_allocated_capacity + 1);
        }
      }
      bVar4 = FlushBlockFile(this,last_blockfile,true,finalize_undo);
      if (!bVar4) {
        pLVar7 = LogInstance();
        bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar7,BLOCKSTORAGE,Warning);
        if (bVar4) {
          logging_function_01._M_str = "FindNextBlockPos";
          logging_function_01._M_len = 0x10;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
          ;
          source_file_01._M_len = 0x65;
          LogPrintFormatInternal<int,bool,int>
                    (logging_function_01,source_file_01,899,BLOCKSTORAGE,Warning,
                     (ConstevalFormatString<3U>)0x7ebaf0,&last_blockfile,&finalize_undo,&nFile);
        }
      }
      _Var13._M_value.undo_height = 0;
      _Var13._M_value.file_num = nFile;
      uVar17 = (ulong)chain_type;
      (this->m_blockfile_cursors)._M_elems[uVar17].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_payload = _Var13;
      if ((this->m_blockfile_cursors)._M_elems[uVar17].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
        (this->m_blockfile_cursors)._M_elems[uVar17].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
      }
    }
    CBlockFileInfo::AddBlock
              ((this->m_blockfile_info).
               super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
               super__Vector_impl_data._M_start + nFile,nHeight_local,nTime);
    puVar1 = &(this->m_blockfile_info).
              super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
              super__Vector_impl_data._M_start[nFile].nSize;
    *puVar1 = *puVar1 + nAddSize;
    sVar10 = FlatFileSeq::Allocate(&this->m_block_file_seq,&pos,(ulong)nAddSize,&out_of_space);
    if (out_of_space == true) {
      pNVar2 = (this->m_opts).notifications;
      new_cursor = (BlockfileCursor)&local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&new_cursor,"Disk space is too low!","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Disk space is too low!","");
      }
      else {
        local_90 = "Disk space is too low!";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_58,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_90);
      }
      (*pNVar2->_vptr_Notifications[8])(pNVar2,&new_cursor);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (new_cursor != (BlockfileCursor)&local_68) {
        operator_delete((void *)new_cursor,local_68._M_allocated_capacity + 1);
      }
      uVar17 = 0xffffffff;
      uVar15 = 0;
    }
    else {
      if ((sVar10 != 0) && (this->m_prune_mode == true)) {
        this->m_check_for_pruning = true;
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->m_dirty_fileinfo,&nFile);
      uVar15 = (ulong)pos.nPos << 0x20;
      uVar17 = (ulong)(uint)pos.nFile;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (FlatFilePos)(uVar15 | uVar17);
    }
    __stack_chk_fail();
  }
  __assert_fail("nAddSize < max_blockfile_size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                ,0x35f,
                "FlatFilePos node::BlockManager::FindNextBlockPos(unsigned int, unsigned int, uint64_t)"
               );
}

Assistant:

FlatFilePos BlockManager::FindNextBlockPos(unsigned int nAddSize, unsigned int nHeight, uint64_t nTime)
{
    LOCK(cs_LastBlockFile);

    const BlockfileType chain_type = BlockfileTypeForHeight(nHeight);

    if (!m_blockfile_cursors[chain_type]) {
        // If a snapshot is loaded during runtime, we may not have initialized this cursor yet.
        assert(chain_type == BlockfileType::ASSUMED);
        const auto new_cursor = BlockfileCursor{this->MaxBlockfileNum() + 1};
        m_blockfile_cursors[chain_type] = new_cursor;
        LogDebug(BCLog::BLOCKSTORAGE, "[%s] initializing blockfile cursor to %s\n", chain_type, new_cursor);
    }
    const int last_blockfile = m_blockfile_cursors[chain_type]->file_num;

    int nFile = last_blockfile;
    if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
        m_blockfile_info.resize(nFile + 1);
    }

    bool finalize_undo = false;
    unsigned int max_blockfile_size{MAX_BLOCKFILE_SIZE};
    // Use smaller blockfiles in test-only -fastprune mode - but avoid
    // the possibility of having a block not fit into the block file.
    if (m_opts.fast_prune) {
        max_blockfile_size = 0x10000; // 64kiB
        if (nAddSize >= max_blockfile_size) {
            // dynamically adjust the blockfile size to be larger than the added size
            max_blockfile_size = nAddSize + 1;
        }
    }
    assert(nAddSize < max_blockfile_size);

    while (m_blockfile_info[nFile].nSize + nAddSize >= max_blockfile_size) {
        // when the undo file is keeping up with the block file, we want to flush it explicitly
        // when it is lagging behind (more blocks arrive than are being connected), we let the
        // undo block write case handle it
        finalize_undo = (static_cast<int>(m_blockfile_info[nFile].nHeightLast) ==
                         Assert(m_blockfile_cursors[chain_type])->undo_height);

        // Try the next unclaimed blockfile number
        nFile = this->MaxBlockfileNum() + 1;
        // Set to increment MaxBlockfileNum() for next iteration
        m_blockfile_cursors[chain_type] = BlockfileCursor{nFile};

        if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
            m_blockfile_info.resize(nFile + 1);
        }
    }
    FlatFilePos pos;
    pos.nFile = nFile;
    pos.nPos = m_blockfile_info[nFile].nSize;

    if (nFile != last_blockfile) {
        LogDebug(BCLog::BLOCKSTORAGE, "Leaving block file %i: %s (onto %i) (height %i)\n",
                 last_blockfile, m_blockfile_info[last_blockfile].ToString(), nFile, nHeight);

        // Do not propagate the return code. The flush concerns a previous block
        // and undo file that has already been written to. If a flush fails
        // here, and we crash, there is no expected additional block data
        // inconsistency arising from the flush failure here. However, the undo
        // data may be inconsistent after a crash if the flush is called during
        // a reindex. A flush error might also leave some of the data files
        // untrimmed.
        if (!FlushBlockFile(last_blockfile, /*fFinalize=*/true, finalize_undo)) {
            LogPrintLevel(BCLog::BLOCKSTORAGE, BCLog::Level::Warning,
                          "Failed to flush previous block file %05i (finalize=1, finalize_undo=%i) before opening new block file %05i\n",
                          last_blockfile, finalize_undo, nFile);
        }
        // No undo data yet in the new file, so reset our undo-height tracking.
        m_blockfile_cursors[chain_type] = BlockfileCursor{nFile};
    }

    m_blockfile_info[nFile].AddBlock(nHeight, nTime);
    m_blockfile_info[nFile].nSize += nAddSize;

    bool out_of_space;
    size_t bytes_allocated = m_block_file_seq.Allocate(pos, nAddSize, out_of_space);
    if (out_of_space) {
        m_opts.notifications.fatalError(_("Disk space is too low!"));
        return {};
    }
    if (bytes_allocated != 0 && IsPruneMode()) {
        m_check_for_pruning = true;
    }

    m_dirty_fileinfo.insert(nFile);
    return pos;
}